

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::set_state_in_checkpoint
          (NavierStokesBase *this,Vector<int,_std::allocator<int>_> *state_in_checkpoint)

{
  int *piVar1;
  size_type in_RSI;
  Vector<int,_std::allocator<int>_> *in_RDI;
  
  if ((gradp_in_checkpoint < 0) || (average_in_checkpoint < 0)) {
    amrex::Abort_host((char *)state_in_checkpoint);
  }
  if (gradp_in_checkpoint == 0) {
    piVar1 = amrex::Vector<int,_std::allocator<int>_>::operator[](in_RDI,in_RSI);
    *piVar1 = 0;
  }
  if ((average_in_checkpoint == 0) && (0 < avg_interval)) {
    piVar1 = amrex::Vector<int,_std::allocator<int>_>::operator[](in_RDI,in_RSI);
    *piVar1 = 0;
  }
  return;
}

Assistant:

void
NavierStokesBase::set_state_in_checkpoint (Vector<int>& state_in_checkpoint)
{
  //
  // Abort if any of the NSB::*_in_checkpoint variables haven't been set by user.
  //
  if ( gradp_in_checkpoint<0 || average_in_checkpoint<0 )
    Abort("\n\n   Checkpoint file is missing one or more state types. Set both\n ns.gradp_in_checkpoint and ns.avg_in_checkpoint to identify missing\n data. Set to 1 if present in checkpoint, 0 if not present. If unsure,\n try setting both to 0.\n\n If you just activated Time Averaging, you should add \n  ns.avg_in_checkpoint=0 ns.gradp_in_checkpoint=1 \n\n");

  //
  // Tell AmrLevel which types are in the checkpoint, so it knows what to copy.
  // state_in_checkpoint is initialized to all true.
  //
  if ( gradp_in_checkpoint==0 )
    state_in_checkpoint[Gradp_Type] = 0;

  if ( average_in_checkpoint==0 && avg_interval>0 )
    state_in_checkpoint[Average_Type] = 0;
}